

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsproto.c
# Opt level: O0

int ldefault(lua_State *L)

{
  int iVar1;
  sproto_type *st_00;
  void *local_80;
  void *tmp;
  int sz;
  sproto_type *st;
  char dummy [64];
  int ret;
  lua_State *L_local;
  
  st_00 = (sproto_type *)lua_touserdata(L,1);
  if (st_00 == (sproto_type *)0x0) {
    L_local._4_4_ = luaL_argerror(L,1,"Need a sproto_type object");
  }
  else {
    lua_createtable(L,0,0);
    iVar1 = sproto_encode(st_00,&st,0x40,encode_default,L);
    if (iVar1 < 0) {
      tmp._4_4_ = 0x80;
      local_80 = lua_newuserdata(L,0x80);
      lua_rotate(L,-2,1);
      while (iVar1 = sproto_encode(st_00,local_80,tmp._4_4_,encode_default,L), iVar1 < 0) {
        tmp._4_4_ = tmp._4_4_ << 1;
        local_80 = lua_newuserdata(L,(long)tmp._4_4_);
        lua_copy(L,-1,-3);
        lua_settop(L,-2);
      }
    }
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int
ldefault(lua_State *L) {
	int ret;
	// 64 is always enough for dummy buffer, except the type has many fields ( > 27).
	char dummy[64];
	struct sproto_type * st = lua_touserdata(L, 1);
	if (st == NULL) {
		return luaL_argerror(L, 1, "Need a sproto_type object");
	}
	lua_newtable(L);
	ret = sproto_encode(st, dummy, sizeof(dummy), encode_default, L);
	if (ret<0) {
		// try again
		int sz = sizeof(dummy) * 2;
		void * tmp = lua_newuserdata(L, sz);
		lua_insert(L, -2);
		for (;;) {
			ret = sproto_encode(st, tmp, sz, encode_default, L);
			if (ret >= 0)
				break;
			sz *= 2;
			tmp = lua_newuserdata(L, sz);
			lua_replace(L, -3);
		}
	}
	return 1;
}